

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DFAContentModel::validateContent
          (DFAContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          XMLSize_t *indexFailingChild,MemoryManager *param_5)

{
  XMLCh XVar1;
  XMLCh XVar2;
  QName *this_00;
  QName *this_01;
  Occurence *pOVar3;
  NodeTypes NVar4;
  int iVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  ulong uVar9;
  XMLSize_t XVar10;
  ulong uVar11;
  bool bVar12;
  uint nextState;
  uint local_5c;
  uint local_58;
  uint local_54;
  XMLSize_t *local_50;
  uint nextLoop;
  uint local_44;
  XMLSize_t local_40;
  QName **local_38;
  
  if (childCount == 0) {
    if (this->fEmptyOk != false) {
      return true;
    }
    *indexFailingChild = 0;
  }
  else {
    nextState = 0;
    local_44 = 0xffffffff;
    local_5c = 0xffffffff;
    XVar10 = 0;
    local_58 = 0;
    local_54 = 0;
    local_50 = indexFailingChild;
    local_40 = childCount;
    local_38 = children;
    do {
      this_00 = local_38[XVar10];
      if (this->fDTD == true) {
        pXVar6 = QName::getRawName(this_00);
      }
      else {
        pXVar6 = (XMLCh *)0x0;
      }
      if ((this->fIsMixed != true) || (bVar12 = false, this_00->fURIId != local_44)) {
        if (this->fElemMapSize == 0) {
          uVar11 = 0;
        }
        else {
          uVar9 = (ulong)local_58;
          uVar11 = 0;
          do {
            this_01 = this->fElemMap[uVar11];
            if (this->fDTD == true) {
              pXVar7 = QName::getRawName(this_01);
              if (pXVar7 == pXVar6) {
LAB_002f1760:
                nextState = this->fTransTable[uVar9][uVar11];
                childCount = local_40;
                if (nextState != local_5c) break;
              }
              else {
                pXVar8 = pXVar6;
                if ((pXVar6 == (XMLCh *)0x0) || (pXVar7 == (XMLCh *)0x0)) {
                  if (pXVar7 == (XMLCh *)0x0) {
                    if (pXVar6 == (XMLCh *)0x0) goto LAB_002f1760;
LAB_002f1755:
                    bVar12 = *pXVar8 == L'\0';
                  }
                  else {
                    bVar12 = *pXVar7 == L'\0';
                    if ((pXVar6 != (XMLCh *)0x0) && (*pXVar7 == L'\0')) goto LAB_002f1755;
                  }
                  if (bVar12) goto LAB_002f1760;
                }
                else {
                  do {
                    XVar1 = *pXVar7;
                    if (XVar1 == L'\0') goto LAB_002f1755;
                    pXVar7 = pXVar7 + 1;
                    XVar2 = *pXVar8;
                    pXVar8 = pXVar8 + 1;
                  } while (XVar1 == XVar2);
                }
              }
            }
            else {
              if (this->fElemMapType[uVar11] == Leaf) {
                if (this_01->fURIId != this_00->fURIId) goto LAB_002f17bd;
                pXVar7 = this_01->fLocalPart;
                pXVar8 = this_00->fLocalPart;
                if (pXVar7 == pXVar8) goto LAB_002f17a2;
                if ((pXVar7 != (XMLCh *)0x0) && (pXVar8 != (XMLCh *)0x0)) {
                  do {
                    XVar1 = *pXVar7;
                    if (XVar1 == L'\0') goto LAB_002f1797;
                    pXVar7 = pXVar7 + 1;
                    XVar2 = *pXVar8;
                    pXVar8 = pXVar8 + 1;
                  } while (XVar1 == XVar2);
                  goto LAB_002f17bd;
                }
                if (pXVar7 == (XMLCh *)0x0) {
                  if (pXVar8 == (XMLCh *)0x0) goto LAB_002f17a2;
LAB_002f1797:
                  bVar12 = *pXVar8 == L'\0';
                }
                else {
                  bVar12 = *pXVar7 == L'\0';
                  if ((pXVar8 != (XMLCh *)0x0) && (*pXVar7 == L'\0')) goto LAB_002f1797;
                }
                if (!bVar12) goto LAB_002f17bd;
LAB_002f17a2:
                nextState = this->fTransTable[uVar9][uVar11];
                iVar5 = 5;
                if (nextState == local_5c) {
LAB_002f17bd:
                  iVar5 = 0;
                }
              }
              else {
                NVar4 = this->fElemMapType[uVar11] & (Any_NS|Any_Other);
                if (NVar4 == Any_NS) {
                  if (this_01->fURIId != this_00->fURIId) goto LAB_002f17bd;
                  goto LAB_002f17a2;
                }
                if (NVar4 != Any_Other) {
                  if (NVar4 == Any) goto LAB_002f17a2;
                  goto LAB_002f17bd;
                }
                if (((this_00->fURIId == 1) || (this_00->fURIId == this_01->fURIId)) ||
                   (nextState = this->fTransTable[uVar9][uVar11], nextState == local_5c)) {
                  iVar5 = 0;
                  bVar12 = true;
                }
                else {
                  iVar5 = 5;
                  bVar12 = false;
                }
                if (bVar12) goto LAB_002f17bd;
              }
              childCount = local_40;
              if (iVar5 != 0) break;
            }
            uVar11 = uVar11 + 1;
            childCount = local_40;
          } while (uVar11 < this->fElemMapSize);
        }
        if ((nextState != local_5c) && ((uint)uVar11 != this->fElemMapSize)) {
          nextLoop = 0;
          iVar5 = (*(this->super_XMLContentModel)._vptr_XMLContentModel[7])
                            (this,this_00,(ulong)local_58,(ulong)local_54,&nextState,&nextLoop,
                             uVar11 & 0xffffffff,0);
          if ((char)iVar5 != '\0') {
            local_58 = nextState;
            local_54 = nextLoop;
            nextState = 0;
            bVar12 = false;
            goto LAB_002f1859;
          }
        }
        *local_50 = XVar10;
        bVar12 = true;
      }
LAB_002f1859:
      if (bVar12) {
        return false;
      }
      XVar10 = (XMLSize_t)((int)XVar10 + 1);
    } while (XVar10 < childCount);
    if (this->fFinalStateFlags[local_58] == true) {
      if (this->fCountingStates == (Occurence **)0x0) {
        return true;
      }
      pOVar3 = this->fCountingStates[local_58];
      if (pOVar3 == (Occurence *)0x0) {
        return true;
      }
      if ((uint)pOVar3->minOccurs <= local_54) {
        return true;
      }
    }
    *local_50 = XVar10;
  }
  return false;
}

Assistant:

bool
DFAContentModel::validateContent( QName** const        children
                                , XMLSize_t            childCount
                                , unsigned int
                                , XMLSize_t*           indexFailingChild
                                , MemoryManager*    const) const
{
    //
    //  If there are no children, then either we fail on the 0th element
    //  or we return success. It depends upon whether this content model
    //  accepts empty content, which we determined earlier.
    //
    if (!childCount)
    {
        // success
        if(fEmptyOk)
            return true;
        *indexFailingChild=0;
        return false;
    }

    //
    //  Lets loop through the children in the array and move our way
    //  through the states. Note that we use the fElemMap array to map
    //  an element index to a state index.
    //
    unsigned int curState = 0;
    unsigned int nextState = 0;
    unsigned int loopCount = 0;
    unsigned int childIndex = 0;
    for (; childIndex < childCount; childIndex++)
    {
        // Get the current element index out
        const QName* curElem = children[childIndex];
        const XMLCh* curElemRawName = 0;
        if (fDTD)
            curElemRawName = curElem->getRawName();

        // If this is text in a Schema mixed content model, skip it.
        if ( fIsMixed &&
            ( curElem->getURI() == XMLElementDecl::fgPCDataElemId))
            continue;

        // Look up this child in our element map
        unsigned int elemIndex = 0;
        for (; elemIndex < fElemMapSize; elemIndex++)
        {
            const QName* inElem  = fElemMap[elemIndex];
            if (fDTD) {
                if (XMLString::equals(inElem->getRawName(), curElemRawName)) {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else {
                ContentSpecNode::NodeTypes type = fElemMapType[elemIndex];
                if (type == ContentSpecNode::Leaf)
                {
                    if ((inElem->getURI() == curElem->getURI()) &&
                    (XMLString::equals(inElem->getLocalPart(), curElem->getLocalPart()))) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f)== ContentSpecNode::Any)
                {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_NS)
                {
                    if (inElem->getURI() == curElem->getURI())
                    {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_Other)
                {
                    // Here we assume that empty string has id 1.
                    //
                    unsigned int uriId = curElem->getURI();
                    if (uriId != 1 && uriId != inElem->getURI()) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
            }
        }//for elemIndex

        // If "nextState" is -1, we found a match, but the transition is invalid
        if (nextState == XMLContentModel::gInvalidTrans)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        // If we didn't find it, then obviously not valid
        if (elemIndex == fElemMapSize)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        unsigned int nextLoop = 0;
        if(!handleRepetitions(curElem, curState, loopCount, nextState, nextLoop, elemIndex, 0))
        {
            *indexFailingChild=childIndex;
            return false;
        }

        curState = nextState;
        loopCount = nextLoop;
        nextState = 0;

    }//for childIndex

    //
    //  We transitioned all the way through the input list. However, that
    //  does not mean that we ended in a final state. So check whether
    //  our ending state is a final state.
    //
    if (!fFinalStateFlags[curState])
    {
        *indexFailingChild=childIndex;
        return false;
    }

    // verify if we exited before the minOccurs was satisfied
    if (fCountingStates != 0) {
        Occurence* o = fCountingStates[curState];
        if (o != 0 && loopCount < (unsigned int)o->minOccurs) {
            // not enough loops on the current state to be considered final.
            *indexFailingChild=childIndex;
            return false;
        }
    }

    //success
    return true;
}